

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

bool __thiscall DPlayerMenu::MouseEvent(DPlayerMenu *this,int type,int x,int y)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint32 uVar4;
  undefined8 in_RAX;
  uint green;
  uint red;
  FListMenuItem *pFVar5;
  int v;
  FName current;
  undefined8 local_28;
  
  pFVar5 = (this->super_DListMenu).mFocusControl;
  local_28 = in_RAX;
  bVar1 = DListMenu::MouseEvent(&this->super_DListMenu,type,x,y);
  if (pFVar5 == (FListMenuItem *)0x0) {
    pFVar5 = (this->super_DListMenu).mFocusControl;
  }
  if (pFVar5 == (FListMenuItem *)0x0) {
    return bVar1;
  }
  (*pFVar5->_vptr_FListMenuItem[7])((long)&local_28 + 4,pFVar5,0);
  if (local_28._4_4_ == 0x1e9) {
    iVar2 = (*pFVar5->_vptr_FListMenuItem[0xb])(pFVar5,0,&local_28);
    if ((char)iVar2 == '\0') {
      return bVar1;
    }
    uVar4 = userinfo_t::GetColor((userinfo_t *)(&DAT_009ba458 + (long)consoleplayer * 0x2a0));
    red = uVar4 >> 0x10 & 0xff;
    green = uVar4 >> 8 & 0xff;
  }
  else {
    if (local_28._4_4_ == 0x1e8) {
      iVar2 = (*pFVar5->_vptr_FListMenuItem[0xb])(pFVar5,0,&local_28);
      if ((char)iVar2 == '\0') {
        return bVar1;
      }
      uVar3 = userinfo_t::GetColor((userinfo_t *)(&DAT_009ba458 + (long)consoleplayer * 0x2a0));
      red = uVar3 >> 0x10 & 0xff;
    }
    else {
      if (local_28._4_4_ != 0x1e7) {
        return bVar1;
      }
      iVar2 = (*pFVar5->_vptr_FListMenuItem[0xb])(pFVar5,0,&local_28);
      if ((char)iVar2 == '\0') {
        return bVar1;
      }
      uVar3 = userinfo_t::GetColor((userinfo_t *)(&DAT_009ba458 + (long)consoleplayer * 0x2a0));
      red = (uint)local_28;
      local_28._0_4_ = uVar3 >> 8 & 0xff;
    }
    green = (uint)local_28;
    local_28._0_4_ = uVar3 & 0xff;
  }
  SendNewColor(this,red,green,(uint)local_28);
  return bVar1;
}

Assistant:

bool DPlayerMenu::MouseEvent(int type, int x, int y)
{
	int v;
	FListMenuItem *li = mFocusControl;
	bool res = Super::MouseEvent(type, x, y);
	if (li == NULL) li = mFocusControl;
	if (li != NULL)
	{
		// Check if the colors have changed
		FName current = li->GetAction(NULL);
		switch(current)
		{
		case NAME_Red:
			if (li->GetValue(0, &v))
			{
				uint32 color = players[consoleplayer].userinfo.GetColor();
				SendNewColor (v, GPART(color), BPART(color));
			}
			break;

		case NAME_Green:
			if (li->GetValue(0, &v))
			{
				uint32 color = players[consoleplayer].userinfo.GetColor();
				SendNewColor (RPART(color), v, BPART(color));
			}
			break;

		case NAME_Blue:
			if (li->GetValue(0, &v))
			{
				uint32 color = players[consoleplayer].userinfo.GetColor();
				SendNewColor (RPART(color), GPART(color), v);
			}
			break;
		}
	}
	return res;
}